

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  U32 UVar1;
  size_t sVar2;
  uint local_110;
  uint local_10c;
  uint local_108;
  U32 limitedSrcLog;
  U32 limitedSrcSize;
  undefined1 local_ec [24];
  undefined1 auStack_d4 [4];
  ZSTD_CCtx_params params;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  ZSTD_frameParameters fParams_local;
  
  if (cdict == (ZSTD_CDict *)0x0) {
    fParams_local.checksumFlag = -0x20;
    fParams_local.noDictIDFlag = -1;
  }
  else {
    params.customMem.opaque = (void *)pledgedSrcSize;
    memcpy(local_ec + 0x14,&cctx->requestedParams,0x90);
    if (((((params.customMem.opaque < (void *)0x20000) ||
          (params.customMem.opaque < (void *)(cdict->dictContentSize * 6))) ||
         (params.customMem.opaque == (void *)0xffffffffffffffff)) || (cdict->compressionLevel == 0))
       && (params.targetCBlockSize._4_4_ != 3)) {
      ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)&limitedSrcLog,cdict);
    }
    else {
      ZSTD_getCParams((ZSTD_compressionParameters *)&limitedSrcLog,cdict->compressionLevel,
                      (unsigned_long_long)params.customMem.opaque,cdict->dictContentSize);
    }
    auStack_d4 = (undefined1  [4])limitedSrcLog;
    params.format = limitedSrcSize;
    params.cParams.windowLog = local_ec._0_4_;
    params.cParams.chainLog = local_ec._4_4_;
    params.cParams.hashLog = local_ec._8_4_;
    params.cParams.searchLog = local_ec._12_4_;
    params.cParams.minMatch = local_ec._16_4_;
    if (params.customMem.opaque != (void *)0xffffffffffffffff) {
      if (params.customMem.opaque < (void *)0x80000) {
        local_108 = (uint)params.customMem.opaque;
      }
      else {
        local_108 = 0x80000;
      }
      if (local_108 < 2) {
        local_10c = 1;
      }
      else {
        UVar1 = ZSTD_highbit32(local_108 - 1);
        local_10c = UVar1 + 1;
      }
      if (local_10c < (uint)auStack_d4) {
        local_110 = (uint)auStack_d4;
      }
      else {
        local_110 = local_10c;
      }
      auStack_d4 = (undefined1  [4])local_110;
    }
    params.cParams._20_8_ = fParams._0_8_;
    params.fParams.contentSizeFlag = fParams.noDictIDFlag;
    fParams_local._4_8_ =
         ZSTD_compressBegin_internal
                   (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,
                    (ZSTD_CCtx_params *)(local_ec + 0x14),(U64)params.customMem.opaque,
                    ZSTDb_not_buffered);
  }
  sVar2._0_4_ = fParams_local.checksumFlag;
  sVar2._4_4_ = fParams_local.noDictIDFlag;
  return sVar2;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 )
                      && (params.attachDictPref != ZSTD_dictForceLoad) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           &params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}